

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnionDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::UnionDatatypeValidator::serialize
          (UnionDatatypeValidator *this,XSerializeEngine *serEng)

{
  bool bVar1;
  XSerializeEngine *serEng_local;
  UnionDatatypeValidator *this_local;
  
  DatatypeValidator::serialize(&this->super_DatatypeValidator,serEng);
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    XSerializeEngine::operator<<(serEng,(bool)(this->fEnumerationInherited & 1));
    XSerializeEngine::operator<<(serEng,(bool)(this->fMemberTypesInherited & 1));
    XTemplateSerializer::storeObject(this->fEnumeration,serEng);
    XTemplateSerializer::storeObject(this->fMemberTypeValidators,serEng);
  }
  else {
    XSerializeEngine::operator>>(serEng,&this->fEnumerationInherited);
    XSerializeEngine::operator>>(serEng,&this->fMemberTypesInherited);
    XTemplateSerializer::loadObject(&this->fEnumeration,8,true,serEng);
    XTemplateSerializer::loadObject(&this->fMemberTypeValidators,4,false,serEng);
  }
  return;
}

Assistant:

void UnionDatatypeValidator::serialize(XSerializeEngine& serEng)
{

    DatatypeValidator::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng<<fEnumerationInherited;
        serEng<<fMemberTypesInherited;

        /***
         * Serialize RefArrayVectorOf<XMLCh>
         * Serialize RefVectorOf<DatatypeValidator>
         ***/
        XTemplateSerializer::storeObject(fEnumeration, serEng);
        XTemplateSerializer::storeObject(fMemberTypeValidators, serEng);
    }
    else
    {
        serEng>>fEnumerationInherited;
        serEng>>fMemberTypesInherited;

        /***
         * Deserialize RefArrayVectorOf<XMLCh>
         * Deserialize RefVectorOf<DatatypeValidator>
         ***/
        XTemplateSerializer::loadObject(&fEnumeration, 8, true, serEng);
        XTemplateSerializer::loadObject(&fMemberTypeValidators, 4, false, serEng);
    }
}